

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_load.cpp
# Opt level: O0

bool __thiscall OPNMIDIplay::LoadBank(OPNMIDIplay *this,string *filename)

{
  bool bVar1;
  char *path;
  undefined1 local_58 [8];
  FileAndMemReader file;
  string *filename_local;
  OPNMIDIplay *this_local;
  
  file.m_mp_tell = (size_t)filename;
  FileAndMemReader::FileAndMemReader((FileAndMemReader *)local_58);
  path = (char *)std::__cxx11::string::c_str();
  FileAndMemReader::openFile((FileAndMemReader *)local_58,path);
  bVar1 = LoadBank(this,(FileAndMemReader *)local_58);
  FileAndMemReader::~FileAndMemReader((FileAndMemReader *)local_58);
  return bVar1;
}

Assistant:

bool OPNMIDIplay::LoadBank(const std::string &filename)
{
    FileAndMemReader file;
    file.openFile(filename.c_str());
    return LoadBank(file);
}